

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

SQInteger __thiscall SQSharedState::ResurrectUnreachable(SQSharedState *this,SQVM *vm)

{
  SQArray *pSVar1;
  int iVar2;
  SQSharedState *in_RDI;
  SQObjectPtr temp;
  SQObject sqo;
  SQObjectType type;
  SQCollectable_conflict *rlast;
  SQArray *ret;
  SQCollectable_conflict *t;
  SQCollectable_conflict *resurrected;
  SQCollectable_conflict *tchain;
  SQInteger n;
  SQInteger in_stack_ffffffffffffff78;
  SQObjectPtr *this_00;
  SQVM *in_stack_ffffffffffffff88;
  SQSharedState *in_stack_ffffffffffffff90;
  SQObjectPtr local_68;
  undefined4 in_stack_ffffffffffffffac;
  SQArray *local_40;
  SQArray *local_38;
  SQArray *local_30;
  SQInteger local_18;
  
  local_18 = 0;
  RunMark(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(SQCollectable_conflict **)in_RDI);
  pSVar1 = (SQArray *)in_RDI->_gc_chain;
  in_RDI->_gc_chain = (SQCollectable_conflict *)0x0;
  local_38 = (SQArray *)0x0;
  if (pSVar1 != (SQArray *)0x0) {
    local_38 = SQArray::Create(in_RDI,in_stack_ffffffffffffff78);
    local_40 = (SQArray *)0x0;
    for (local_30 = pSVar1; local_30 != (SQArray *)0x0;
        local_30 = (SQArray *)(local_30->super_SQCollectable)._next) {
      local_40 = local_30;
      iVar2 = (*(local_30->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[3])();
      if ((iVar2 != 0x8002000) && (iVar2 != 0x8020000)) {
        SQArray::Append(local_30,(SQObject *)CONCAT44(in_stack_ffffffffffffffac,iVar2));
      }
      local_18 = local_18 + 1;
    }
    (local_40->super_SQCollectable)._next = (SQCollectable *)in_RDI->_gc_chain;
    if (in_RDI->_gc_chain != (SQCollectable_conflict *)0x0) {
      in_RDI->_gc_chain->_prev = (SQCollectable_conflict *)local_40;
    }
    in_RDI->_gc_chain = (SQCollectable_conflict *)pSVar1;
  }
  for (local_30 = (SQArray *)in_RDI->_gc_chain; local_30 != (SQArray *)0x0;
      local_30 = *(SQArray **)((long)local_30 + 0x18)) {
    SQCollectable::UnMark(&local_30->super_SQCollectable);
  }
  if (local_38 == (SQArray *)0x0) {
    SQVM::PushNull((SQVM *)0x1404f1);
  }
  else {
    this_00 = &local_68;
    ::SQObjectPtr::SQObjectPtr(this_00,local_38);
    SQVM::Push((SQVM *)in_RDI,this_00);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  }
  return local_18;
}

Assistant:

SQInteger SQSharedState::ResurrectUnreachable(SQVM *vm)
{
    SQInteger n=0;
    SQCollectable *tchain=NULL;

    RunMark(vm,&tchain);

    SQCollectable *resurrected = _gc_chain;
    SQCollectable *t = resurrected;

    _gc_chain = tchain;

    SQArray *ret = NULL;
    if(resurrected) {
        ret = SQArray::Create(this,0);
        SQCollectable *rlast = NULL;
        while(t) {
            rlast = t;
            SQObjectType type = t->GetType();
            if(type != OT_FUNCPROTO && type != OT_OUTER) {
                SQObject sqo;
                sqo._type = type;
                sqo._unVal.pRefCounted = t;
                ret->Append(sqo);
            }
            t = t->_next;
            n++;
        }

        assert(rlast->_next == NULL);
        rlast->_next = _gc_chain;
        if(_gc_chain)
        {
            _gc_chain->_prev = rlast;
        }
        _gc_chain = resurrected;
    }

    t = _gc_chain;
    while(t) {
        t->UnMark();
        t = t->_next;
    }

    if(ret) {
        SQObjectPtr temp = ret;
        vm->Push(temp);
    }
    else {
        vm->PushNull();
    }
    return n;
}